

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyply.h
# Opt level: O0

Type tinyply::property_type_from_string(string *t)

{
  bool bVar1;
  string *t_local;
  
  bVar1 = std::operator==(t,"int8");
  if ((bVar1) || (bVar1 = std::operator==(t,"char"), bVar1)) {
    return INT8;
  }
  bVar1 = std::operator==(t,"uint8");
  if ((bVar1) || (bVar1 = std::operator==(t,"uchar"), bVar1)) {
    return UINT8;
  }
  bVar1 = std::operator==(t,"int16");
  if ((bVar1) || (bVar1 = std::operator==(t,"short"), bVar1)) {
    return INT16;
  }
  bVar1 = std::operator==(t,"uint16");
  if ((bVar1) || (bVar1 = std::operator==(t,"ushort"), bVar1)) {
    return UINT16;
  }
  bVar1 = std::operator==(t,"int32");
  if ((bVar1) || (bVar1 = std::operator==(t,"int"), bVar1)) {
    return INT32;
  }
  bVar1 = std::operator==(t,"uint32");
  if ((bVar1) || (bVar1 = std::operator==(t,"uint"), bVar1)) {
    return UINT32;
  }
  bVar1 = std::operator==(t,"float32");
  if ((bVar1) || (bVar1 = std::operator==(t,"float"), bVar1)) {
    return FLOAT32;
  }
  bVar1 = std::operator==(t,"float64");
  if ((!bVar1) && (bVar1 = std::operator==(t,"double"), !bVar1)) {
    return INVALID;
  }
  return FLOAT64;
}

Assistant:

inline Type property_type_from_string(const std::string & t) noexcept
{
    if (t == "int8" || t == "char")           return Type::INT8;
    else if (t == "uint8" || t == "uchar")    return Type::UINT8;
    else if (t == "int16" || t == "short")    return Type::INT16;
    else if (t == "uint16" || t == "ushort")  return Type::UINT16;
    else if (t == "int32" || t == "int")      return Type::INT32;
    else if (t == "uint32" || t == "uint")    return Type::UINT32;
    else if (t == "float32" || t == "float")  return Type::FLOAT32;
    else if (t == "float64" || t == "double") return Type::FLOAT64;
    return Type::INVALID;
}